

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O0

DataStreamType * __thiscall yactfr::internal::TraceTypeImpl::findDst(TraceTypeImpl *this,TypeId id)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
  local_28;
  const_iterator it;
  TypeId id_local;
  TraceTypeImpl *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false>
               )id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long_long,_const_yactfr::DataStreamType_*,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>_>_>
       ::find(&this->_idsToDsts,(key_type *)&it);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long_long,_const_yactfr::DataStreamType_*,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>_>_>
       ::end(&this->_idsToDsts);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (TraceTypeImpl *)0x0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>,_false,_false>
                           *)&local_28);
    this_local = (TraceTypeImpl *)pvVar2->second;
  }
  return (DataStreamType *)this_local;
}

Assistant:

const DataStreamType *TraceTypeImpl::findDst(const TypeId id) const noexcept
{
    auto it = _idsToDsts.find(id);

    if (it == _idsToDsts.end()) {
        return nullptr;
    }

    return it->second;
}